

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmGen9TextureCalc::GetMipTailGeometryOffset
          (GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel,uint32_t *OffsetX,
          uint32_t *OffsetY,uint32_t *OffsetZ)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint local_3c;
  uint32_t Slot;
  uint32_t ArrayIndex;
  uint32_t *OffsetZ_local;
  uint32_t *OffsetY_local;
  uint32_t *OffsetX_local;
  uint32_t MipLevel_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  local_3c = 0;
  uVar1 = pTexInfo->BitsPerPixel;
  if (uVar1 == 8) {
    local_3c = 4;
  }
  else if (uVar1 == 0x10) {
    local_3c = 3;
  }
  else if (uVar1 == 0x20) {
    local_3c = 2;
  }
  else if (uVar1 == 0x40) {
    local_3c = 1;
  }
  else if (uVar1 == 0x80) {
    local_3c = 0;
  }
  if (pTexInfo->Type == RESOURCE_1D) {
    iVar3 = 0;
    if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
      iVar3 = 4;
    }
    uVar2 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + iVar3;
    *OffsetX = Gen9MipTailSlotOffset1DSurface[uVar2][local_3c].X * pTexInfo->BitsPerPixel >> 3;
    *OffsetY = Gen9MipTailSlotOffset1DSurface[uVar2][local_3c].Y;
    *OffsetZ = Gen9MipTailSlotOffset1DSurface[uVar2][local_3c].Z;
  }
  else if ((pTexInfo->Type == RESOURCE_2D) || (pTexInfo->Type == RESOURCE_CUBE)) {
    if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 0x10))
    {
      if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 8))
      {
        if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) || ((pTexInfo->MSAA).NumSamples != 4)
           ) {
          if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) ||
             ((pTexInfo->MSAA).NumSamples != 2)) {
            if ((SUB84((pTexInfo->Flags).Info,4) >> 6 & 1) == 0) {
              local_5c = 0;
              if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
                local_5c = 4;
              }
            }
            else {
              local_5c = 0;
            }
            local_58 = local_5c;
          }
          else {
            local_58 = 1;
          }
          local_54 = local_58;
        }
        else {
          local_54 = 2;
        }
        local_50 = local_54;
      }
      else {
        local_50 = 3;
      }
      local_4c = local_50;
    }
    else {
      local_4c = 4;
    }
    uVar2 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + local_4c;
    *OffsetX = Gen9MipTailSlotOffset2DSurface[uVar2][local_3c].X * pTexInfo->BitsPerPixel >> 3;
    *OffsetY = Gen9MipTailSlotOffset2DSurface[uVar2][local_3c].Y;
    *OffsetZ = Gen9MipTailSlotOffset2DSurface[uVar2][local_3c].Z;
  }
  else if (pTexInfo->Type == RESOURCE_3D) {
    iVar3 = 0;
    if ((SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) != 0) {
      iVar3 = 4;
    }
    uVar2 = (MipLevel - (pTexInfo->Alignment).MipTailStartLod) + iVar3;
    *OffsetX = Gen9MipTailSlotOffset3DSurface[uVar2][local_3c].X * pTexInfo->BitsPerPixel >> 3;
    *OffsetY = Gen9MipTailSlotOffset3DSurface[uVar2][local_3c].Y;
    *OffsetZ = Gen9MipTailSlotOffset3DSurface[uVar2][local_3c].Z;
  }
  return;
}

Assistant:

void GmmLib::GmmGen9TextureCalc::GetMipTailGeometryOffset(GMM_TEXTURE_INFO *pTexInfo,
                                                          uint32_t          MipLevel,
                                                          uint32_t *        OffsetX,
                                                          uint32_t *        OffsetY,
                                                          uint32_t *        OffsetZ)
{
    uint32_t ArrayIndex = 0;
    uint32_t Slot       = 0;

    GMM_DPF_ENTER;

    switch(pTexInfo->BitsPerPixel)
    {
        case 128:
            ArrayIndex = 0;
            break;
        case 64:
            ArrayIndex = 1;
            break;
        case 32:
            ArrayIndex = 2;
            break;
        case 16:
            ArrayIndex = 3;
            break;
        case 8:
            ArrayIndex = 4;
            break;
        default:
            __GMM_ASSERT(0);
            break;
    }

    if(pTexInfo->Type == RESOURCE_1D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset1DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_2D || pTexInfo->Type == RESOURCE_CUBE)
    {
        // clang-format off
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
                    // TileYs
                   ((pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples == 16) ? 4 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  8) ? 3 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  4) ? 2 :
                    (pTexInfo->Flags.Info.TiledYs && pTexInfo->MSAA.NumSamples ==  2) ? 1 :
                    (pTexInfo->Flags.Info.TiledYs                                   ) ? 0 :
                    // TileYf
                    (pTexInfo->Flags.Info.TiledYf                                   ) ?  4: 0);
        // clang-format on

        *OffsetX = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset2DSurface[Slot][ArrayIndex].Z;
    }
    else if(pTexInfo->Type == RESOURCE_3D)
    {
        Slot = MipLevel - pTexInfo->Alignment.MipTailStartLod +
               (pTexInfo->Flags.Info.TiledYf ? 4 : 0);

        *OffsetX = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].X * pTexInfo->BitsPerPixel / 8;
        *OffsetY = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].Y;
        *OffsetZ = Gen9MipTailSlotOffset3DSurface[Slot][ArrayIndex].Z;
    }

    GMM_DPF_EXIT;
    return;
}